

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O2

int __thiscall tcmalloc::CentralFreeList::tc_length(CentralFreeList *this)

{
  int iVar1;
  int iVar2;
  SpinLockHolder local_28;
  SpinLockHolder h;
  
  local_28.lock_ = &this->lock_;
  SpinLock::Lock(&this->lock_);
  iVar1 = (&DAT_0013bc84)[(uint)this->size_class_];
  iVar2 = this->used_slots_;
  SpinLockHolder::~SpinLockHolder(&local_28);
  return iVar1 * iVar2;
}

Assistant:

int CentralFreeList::tc_length() {
  SpinLockHolder h(&lock_);
  return used_slots_ * Static::sizemap()->num_objects_to_move(size_class_);
}